

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rga_test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  RK_U32 RVar3;
  RK_U32 RVar4;
  MPP_RET MVar5;
  size_t sVar6;
  FILE *__stream;
  FILE *__stream_00;
  RK_U8 *buf;
  uint uVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  MppFrame src_frm;
  uint local_27c;
  MppFrame dst_frm;
  RgaCtx ctx;
  MppBuffer dst_buf;
  MppBuffer src_buf;
  ulong local_258;
  RgaTestCmd cmd;
  
  _mpp_log_l(4,0,"rga test unit\n",0);
  src_buf = (MppBuffer)0x0;
  dst_buf = (MppBuffer)0x0;
  src_frm = (MppFrame)0x0;
  dst_frm = (MppFrame)0x0;
  ctx = (RgaCtx)0x0;
  memset(&cmd,0,0x220);
  if (argc < 2) {
LAB_001026e6:
    _mpp_log_l(4,0,
               "usage:./rga_test -i input -o output_file -w src_w -h src_h -f src_fmt -dst_w dst_w -dst_h dst_h -dst_fmt dst_fmt\n"
               ,0);
  }
  else {
    local_27c = 0xffffffff;
    lVar9 = 0;
    pcVar8 = argv[1];
    do {
      pcVar2 = argv[lVar9 + 2];
      if ((*pcVar8 == '-') && (cVar1 = pcVar8[1], cVar1 != '\0')) {
        if (cVar1 == '-') {
          cVar1 = pcVar8[2];
          if (cVar1 == '\0') break;
          pcVar8 = pcVar8 + 1;
        }
        switch(cVar1) {
        case 'd':
          if (pcVar8[2] == '\0') {
LAB_00102697:
            pcVar8 = "dst parameters is invalid\n";
LAB_001026cb:
            _mpp_log_l(2,0,pcVar8,0);
            goto LAB_001026db;
          }
          pcVar8 = pcVar8 + 1;
          iVar11 = strncmp(pcVar8,"dst_w",5);
          if (iVar11 == 0) {
            cmd.dst_w = atoi(pcVar2);
          }
          else {
            iVar11 = strncmp(pcVar8,"dst_h",5);
            if (iVar11 == 0) {
              cmd.dst_h = atoi(pcVar2);
            }
            else {
              iVar11 = strncmp(pcVar8,"dst_fmt",5);
              if (iVar11 != 0) goto LAB_00102697;
              cmd.dst_fmt = atoi(pcVar2);
            }
          }
          break;
        case 'e':
        case 'g':
        case 'j':
        case 'k':
        case 'l':
        case 'm':
        case 'n':
          break;
        case 'f':
          if (pcVar2 == (char *)0x0) {
            pcVar8 = "src fmt is invalid\n";
            goto LAB_001026cb;
          }
          cmd.src_fmt = atoi(pcVar2);
          local_27c = 1;
          if (0xffeb < cmd.src_fmt - MPP_FMT_YUV_BUTT) {
            local_27c = (uint)(0x1000f < (int)cmd.src_fmt);
          }
          break;
        case 'h':
          if (pcVar2 == (char *)0x0) {
            pcVar8 = "src height is invalid\n";
            goto LAB_001026cb;
          }
          cmd.src_h = atoi(pcVar2);
          break;
        case 'i':
          if (pcVar2 == (char *)0x0) {
            pcVar8 = "input file is invalid\n";
            goto LAB_001026cb;
          }
          strncpy(cmd.input_file,pcVar2,0xff);
          sVar6 = strlen(pcVar2);
          cmd.input_file[sVar6] = '\0';
          cmd.have_input = 1;
          break;
        case 'o':
          if (pcVar2 == (char *)0x0) {
            pcVar8 = "output file is invalid\n";
            goto LAB_001026cb;
          }
          strncpy(cmd.output_file,pcVar2,0xff);
          sVar6 = strlen(pcVar2);
          cmd.output_file[sVar6] = '\0';
          cmd.have_output = 1;
          break;
        default:
          if (cVar1 == 'w') {
            if (pcVar2 == (char *)0x0) {
              pcVar8 = "src width is invalid\n";
              goto LAB_001026cb;
            }
            cmd.src_w = atoi(pcVar2);
          }
        }
      }
      lVar9 = lVar9 + 1;
      pcVar8 = pcVar2;
    } while ((ulong)(uint)argc - 1 != lVar9);
LAB_001026db:
    if (local_27c != 0) goto LAB_001026e6;
    __stream = (FILE *)0x0;
    pcVar2 = cmd.output_file;
    pcVar8 = cmd.input_file;
    _mpp_log_l(4,0,"src w:%d h:%d fmt:%d dst w:%d h:%d fmt:%d input:%s output:%s\n",0,cmd.src_w,
               cmd.src_h,cmd.src_fmt,cmd.dst_w,cmd.dst_h,cmd.dst_fmt,pcVar8,pcVar2);
    RVar4 = cmd.dst_h;
    RVar3 = cmd.src_h;
    local_27c = cmd.src_w;
    uVar10 = (ulong)cmd.dst_w;
    if ((cmd.have_input == 0) || (__stream = fopen(pcVar8,"r"), __stream != (FILE *)0x0)) {
      local_258 = uVar10;
      if (cmd.have_output == 0) {
        __stream_00 = (FILE *)0x0;
      }
      else {
        __stream_00 = fopen(pcVar2,"w+");
        if (__stream_00 == (FILE *)0x0) {
          __stream_00 = (FILE *)0x0;
          _mpp_log_l(4,0,"open output file %s failed\n",0,pcVar2);
          MVar5 = MPP_NOK;
          goto LAB_00102707;
        }
      }
      iVar11 = local_27c * RVar3 * 4;
      MVar5 = mpp_buffer_get_with_tag(0,&src_buf,iVar11,0,"main");
      if (MVar5 == MPP_OK) {
        iVar11 = (int)local_258 * RVar4 * 4;
        MVar5 = mpp_buffer_get_with_tag(0,&dst_buf,iVar11,0,"main");
        if (MVar5 == MPP_OK) {
          MVar5 = mpp_frame_init(&src_frm);
          if (MVar5 == MPP_OK) {
            MVar5 = mpp_frame_init(&dst_frm);
            if (MVar5 == MPP_OK) {
              buf = (RK_U8 *)mpp_buffer_get_ptr_with_caller(src_buf,"main");
              if (cmd.have_input == 0) {
                MVar5 = fill_image(buf,cmd.src_w,cmd.src_h,cmd.src_w,cmd.src_h,cmd.src_fmt,0);
                if (MVar5 == MPP_OK) goto LAB_00102a09;
                pcVar8 = "failed to fill input buffer ret:%d\n";
              }
              else {
                MVar5 = read_image(buf,(FILE *)__stream,cmd.src_w,cmd.src_h,cmd.src_w,cmd.src_h,
                                   cmd.dst_fmt);
                if (MVar5 == MPP_OK) {
LAB_00102a09:
                  uVar7 = local_27c;
                  mpp_frame_set_buffer(src_frm,src_buf);
                  mpp_frame_set_width(src_frm,uVar7);
                  mpp_frame_set_height(src_frm,RVar3);
                  mpp_frame_set_hor_stride(src_frm,uVar7 + 0xf & 0xfffffff0);
                  uVar7 = RVar3 + 0xf & 0xfffffff0;
                  mpp_frame_set_ver_stride(src_frm,uVar7);
                  mpp_frame_set_fmt(src_frm,cmd.src_fmt);
                  mpp_frame_set_buffer(dst_frm,dst_buf);
                  iVar11 = (int)local_258;
                  mpp_frame_set_width(dst_frm,local_258 & 0xffffffff);
                  mpp_frame_set_height(dst_frm,RVar4);
                  uVar12 = iVar11 + 0xfU & 0xfffffff0;
                  mpp_frame_set_hor_stride(dst_frm,uVar12);
                  mpp_frame_set_ver_stride(dst_frm,RVar4 + 0xf & 0xfffffff0);
                  mpp_frame_set_fmt(dst_frm);
                  MVar5 = rga_init(&ctx);
                  if (MVar5 == MPP_OK) {
                    MVar5 = rga_control(ctx,RGA_CMD_INIT,(void *)0x0);
                    if (MVar5 == MPP_OK) {
                      MVar5 = rga_control(ctx,RGA_CMD_SET_SRC,src_frm);
                      if (MVar5 == MPP_OK) {
                        MVar5 = rga_control(ctx,RGA_CMD_SET_DST,dst_frm);
                        if (MVar5 == MPP_OK) {
                          MVar5 = rga_control(ctx,RGA_CMD_RUN_SYNC,(void *)0x0);
                          if (MVar5 == MPP_OK) {
                            mpp_frame_set_buffer(src_frm,dst_buf);
                            mpp_frame_set_width(src_frm,local_258);
                            mpp_frame_set_height(src_frm,RVar4 >> 1);
                            mpp_frame_set_hor_stride(src_frm,uVar12 * 2);
                            mpp_frame_set_ver_stride(src_frm,uVar7 >> 1);
                            mpp_frame_set_fmt(src_frm);
                            MVar5 = rga_control(ctx,RGA_CMD_INIT,(void *)0x0);
                            if (MVar5 != MPP_OK) goto LAB_00102af5;
                            MVar5 = rga_control(ctx,RGA_CMD_SET_SRC,src_frm);
                            if (MVar5 != MPP_OK) goto LAB_00102b17;
                            MVar5 = rga_control(ctx,RGA_CMD_SET_DST,dst_frm);
                            if (MVar5 != MPP_OK) goto LAB_00102b3a;
                            MVar5 = rga_control(ctx,RGA_CMD_RUN_SYNC,(void *)0x0);
                            if (MVar5 == MPP_OK) {
                              MVar5 = rga_deinit(ctx);
                              if (MVar5 == MPP_OK) {
                                MVar5 = MPP_OK;
                                if (cmd.have_output != 0) {
                                  dump_mpp_frame_to_file(dst_frm,(FILE *)__stream_00);
                                  MVar5 = MPP_OK;
                                }
                                goto LAB_00102707;
                              }
                              pcVar8 = "deinit rga context failed %d\n";
                              goto LAB_00102b63;
                            }
                          }
                          pcVar8 = "rga cmd process copy failed %d\n";
                        }
                        else {
LAB_00102b3a:
                          pcVar8 = "rga cmd setup destination failed %d\n";
                        }
                      }
                      else {
LAB_00102b17:
                        pcVar8 = "rga cmd setup source failed %d\n";
                      }
                    }
                    else {
LAB_00102af5:
                      pcVar8 = "rga cmd init failed %d\n";
                    }
                  }
                  else {
                    pcVar8 = "init rga context failed %d\n";
                  }
                }
                else {
                  pcVar8 = "failed to read input file ret:%d\n";
                }
              }
LAB_00102b63:
              _mpp_log_l(2,0,pcVar8,0,MVar5);
              goto LAB_00102707;
            }
            pcVar8 = "failed to init dst frame\n";
          }
          else {
            pcVar8 = "failed to init src frame\n";
          }
          _mpp_log_l(2,0,pcVar8,0);
          goto LAB_00102707;
        }
        pcVar8 = "failed to get dst buffer %d with size %d\n";
      }
      else {
        pcVar8 = "failed to get src buffer %d with size %d\n";
      }
      _mpp_log_l(2,0,pcVar8,0,MVar5,iVar11);
      goto LAB_00102707;
    }
    _mpp_log_l(4,0,"open input file %s failed\n",0,pcVar8);
  }
  __stream_00 = (FILE *)0x0;
  __stream = (FILE *)0x0;
  MVar5 = MPP_NOK;
LAB_00102707:
  if (src_frm != (MppFrame)0x0) {
    mpp_frame_deinit(&src_frm);
  }
  if (dst_frm != (MppFrame)0x0) {
    mpp_frame_deinit(&dst_frm);
  }
  if (src_buf != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller(src_buf,"main");
  }
  if (dst_buf != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller(dst_buf,"main");
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  if (__stream_00 != (FILE *)0x0) {
    fclose(__stream_00);
  }
  _mpp_log_l(4,0,"rga test exit ret %d\n",0,MVar5);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    mpp_log("rga test unit\n");

    MPP_RET ret = MPP_NOK;
    RgaTestCmd cmd;
    MppBuffer src_buf = NULL;
    MppBuffer dst_buf = NULL;
    MppFrame src_frm = NULL;
    MppFrame dst_frm = NULL;
    FILE *fin = NULL;
    FILE *fout = NULL;
    RgaCtx ctx = NULL;
    RK_U32 frame_count = 0;

    void *ptr;
    RK_U32 src_w;
    RK_U32 src_h;
    RK_U32 dst_w;
    RK_U32 dst_h;
    RK_U32 src_size;
    RK_U32 dst_size;

    memset(&cmd, 0, sizeof(cmd));
    if (rga_test_parse_options(argc, argv, &cmd)) {
        usage();
        goto END;
    }

    mpp_log("src w:%d h:%d fmt:%d dst w:%d h:%d fmt:%d input:%s output:%s\n",
            cmd.src_w, cmd.src_h, cmd.src_fmt,
            cmd.dst_w, cmd.dst_h, cmd.dst_fmt,
            cmd.input_file, cmd.output_file);

    src_w = cmd.src_w;
    src_h = cmd.src_h;
    dst_w = cmd.dst_w;
    dst_h = cmd.dst_h;
    src_size = src_w * src_h * 4;
    dst_size = dst_w * dst_h * 4;

    if (cmd.have_input) {
        fin = fopen(cmd.input_file, "r");
        if (!fin) {
            mpp_log("open input file %s failed\n", cmd.input_file);
            goto END;
        }
    }

    if (cmd.have_output) {
        fout = fopen(cmd.output_file, "w+");
        if (!fout) {
            mpp_log("open output file %s failed\n", cmd.output_file);
            goto END;
        }
    }

    ret = mpp_buffer_get(NULL, &src_buf, src_size);
    if (ret) {
        mpp_err("failed to get src buffer %d with size %d\n", ret, src_size);
        goto END;
    }

    ret = mpp_buffer_get(NULL, &dst_buf, dst_size);
    if (ret) {
        mpp_err("failed to get dst buffer %d with size %d\n", ret, dst_size);
        goto END;
    }

    ret = mpp_frame_init(&src_frm);
    if (ret) {
        mpp_err("failed to init src frame\n");
        goto END;
    }

    ret = mpp_frame_init(&dst_frm);
    if (ret) {
        mpp_err("failed to init dst frame\n");
        goto END;
    }

    ptr = mpp_buffer_get_ptr(src_buf);
    if (cmd.have_input) {
        ret = read_image((RK_U8 *)ptr, fin, cmd.src_w, cmd.src_h,
                         cmd.src_w, cmd.src_h, cmd.dst_fmt);
        if (ret) {
            mpp_err("failed to read input file ret:%d\n", ret);
            goto END;
        }
    } else {
        ret = fill_image((RK_U8 *)ptr, cmd.src_w, cmd.src_h,
                         cmd.src_w, cmd.src_h, cmd.src_fmt, frame_count);
        if (ret) {
            mpp_err("failed to fill input buffer ret:%d\n", ret);
            goto END;
        }
    }

    mpp_frame_set_buffer(src_frm, src_buf);
    mpp_frame_set_width(src_frm, src_w);
    mpp_frame_set_height(src_frm, src_h);
    mpp_frame_set_hor_stride(src_frm, MPP_ALIGN(src_w, 16));
    mpp_frame_set_ver_stride(src_frm, MPP_ALIGN(src_h, 16));
    mpp_frame_set_fmt(src_frm, cmd.src_fmt);

    mpp_frame_set_buffer(dst_frm, dst_buf);
    mpp_frame_set_width(dst_frm, dst_w);
    mpp_frame_set_height(dst_frm, dst_h);
    mpp_frame_set_hor_stride(dst_frm, MPP_ALIGN(dst_w, 16));
    mpp_frame_set_ver_stride(dst_frm, MPP_ALIGN(dst_h, 16));
    mpp_frame_set_fmt(dst_frm, cmd.dst_fmt);

    ret = rga_init(&ctx);
    if (ret) {
        mpp_err("init rga context failed %d\n", ret);
        goto END;
    }

    // start copy process
    ret = rga_control(ctx, RGA_CMD_INIT, NULL);
    if (ret) {
        mpp_err("rga cmd init failed %d\n", ret);
        goto END;
    }

    ret = rga_control(ctx, RGA_CMD_SET_SRC, src_frm);
    if (ret) {
        mpp_err("rga cmd setup source failed %d\n", ret);
        goto END;
    }

    ret = rga_control(ctx, RGA_CMD_SET_DST, dst_frm);
    if (ret) {
        mpp_err("rga cmd setup destination failed %d\n", ret);
        goto END;
    }

    ret = rga_control(ctx, RGA_CMD_RUN_SYNC, NULL);
    if (ret) {
        mpp_err("rga cmd process copy failed %d\n", ret);
        goto END;
    }

    // start field duplicate process
    mpp_frame_set_buffer(src_frm, dst_buf);
    mpp_frame_set_width(src_frm, dst_w);
    mpp_frame_set_height(src_frm, dst_h / 2);
    mpp_frame_set_hor_stride(src_frm, MPP_ALIGN(dst_w, 16) * 2);
    mpp_frame_set_ver_stride(src_frm, MPP_ALIGN(src_h, 16) / 2);
    mpp_frame_set_fmt(src_frm, cmd.dst_fmt);

    ret = rga_control(ctx, RGA_CMD_INIT, NULL);
    if (ret) {
        mpp_err("rga cmd init failed %d\n", ret);
        goto END;
    }

    ret = rga_control(ctx, RGA_CMD_SET_SRC, src_frm);
    if (ret) {
        mpp_err("rga cmd setup source failed %d\n", ret);
        goto END;
    }

    ret = rga_control(ctx, RGA_CMD_SET_DST, dst_frm);
    if (ret) {
        mpp_err("rga cmd setup destination failed %d\n", ret);
        goto END;
    }

    ret = rga_control(ctx, RGA_CMD_RUN_SYNC, NULL);
    if (ret) {
        mpp_err("rga cmd process copy failed %d\n", ret);
        goto END;
    }

    ret = rga_deinit(ctx);
    if (ret) {
        mpp_err("deinit rga context failed %d\n", ret);
        goto END;
    }

    if (cmd.have_output)
        dump_mpp_frame_to_file(dst_frm, fout);

END:
    if (src_frm)
        mpp_frame_deinit(&src_frm);

    if (dst_frm)
        mpp_frame_deinit(&dst_frm);

    if (src_buf)
        mpp_buffer_put(src_buf);

    if (dst_buf)
        mpp_buffer_put(dst_buf);

    if (fin)
        fclose(fin);

    if (fout)
        fclose(fout);

    mpp_log("rga test exit ret %d\n", ret);
    return 0;
}